

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint *puVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uivector nextcode;
  uivector blcount;
  uivector local_78;
  uivector local_58;
  long lVar19;
  
  local_58.data = (uint *)0x0;
  local_58.size = 0;
  local_58.allocsize = 0;
  local_78.data = (uint *)0x0;
  local_78.size = 0;
  local_78.allocsize = 0;
  puVar6 = (uint *)malloc((ulong)tree->numcodes << 2);
  sVar4 = local_58.size;
  uVar9 = 0x53;
  if (puVar6 != (uint *)0x0) {
    uVar9 = 0;
  }
  tree->tree1d = puVar6;
  uVar7 = (ulong)(tree->maxbitlen + 1);
  uVar5 = uivector_resize(&local_58,uVar7);
  if (((sVar4 <= uVar7 && uVar7 - sVar4 != 0) & (byte)uVar5) == 1) {
    memset(local_58.data + sVar4,0,(uVar7 - sVar4) * 4);
  }
  sVar4 = local_78.size;
  if (uVar5 != 0) {
    uVar7 = (ulong)(tree->maxbitlen + 1);
    uVar5 = uivector_resize(&local_78,uVar7);
    if (((sVar4 <= uVar7 && uVar7 - sVar4 != 0) & (byte)uVar5) == 1) {
      memset(local_78.data + sVar4,0,(uVar7 - sVar4) * 4);
    }
    if (uVar5 != 0) goto LAB_001b7dbc;
  }
  uVar9 = 0x53;
LAB_001b7dbc:
  if (uVar9 == 0) {
    if (tree->numcodes != 0) {
      puVar6 = tree->lengths;
      uVar7 = 0;
      do {
        local_58.data[puVar6[uVar7]] = local_58.data[puVar6[uVar7]] + 1;
        uVar9 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar9;
      } while (uVar9 != tree->numcodes);
    }
    if (tree->maxbitlen != 0) {
      uVar7 = 1;
      do {
        uVar9 = (int)uVar7 - 1;
        local_78.data[uVar7] = (local_58.data[uVar9] + local_78.data[uVar9]) * 2;
        uVar9 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar9;
      } while (uVar9 <= tree->maxbitlen);
    }
    if (tree->numcodes != 0) {
      puVar6 = tree->lengths;
      uVar9 = 0;
      do {
        uVar7 = (ulong)puVar6[uVar9];
        if (uVar7 != 0) {
          uVar5 = local_78.data[uVar7];
          local_78.data[uVar7] = uVar5 + 1;
          tree->tree1d[uVar9] = uVar5;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != tree->numcodes);
    }
    local_58.size = 0;
    local_58.allocsize = 0;
    free(local_58.data);
    local_58.data = (uint *)0x0;
    local_78.size = 0;
    local_78.allocsize = 0;
    free(local_78.data);
    local_78.data = (uint *)0x0;
    uVar9 = tree->numcodes;
    uVar7 = (ulong)(uVar9 * 2);
    puVar6 = (uint *)malloc(uVar7 * 4);
    tree->tree2d = puVar6;
    auVar3 = _DAT_001ea020;
    if (puVar6 == (uint *)0x0) {
      uVar9 = 0x53;
    }
    else {
      if (uVar7 != 0) {
        lVar19 = uVar7 - 1;
        auVar16._8_4_ = (int)lVar19;
        auVar16._0_8_ = lVar19;
        auVar16._12_4_ = (int)((ulong)lVar19 >> 0x20);
        uVar8 = 0;
        auVar16 = auVar16 ^ _DAT_001ea020;
        auVar18 = _DAT_001eb4d0;
        auVar20 = _DAT_001eb470;
        do {
          auVar21 = auVar20 ^ auVar3;
          iVar17 = auVar16._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar17 && auVar16._0_4_ < auVar21._0_4_ ||
                      iVar17 < auVar21._4_4_) & 1)) {
            puVar6[uVar8] = 0x7fff;
          }
          if ((auVar21._12_4_ != auVar16._12_4_ || auVar21._8_4_ <= auVar16._8_4_) &&
              auVar21._12_4_ <= auVar16._12_4_) {
            puVar6[uVar8 + 1] = 0x7fff;
          }
          auVar21 = auVar18 ^ auVar3;
          iVar10 = auVar21._4_4_;
          if (iVar10 <= iVar17 && (iVar10 != iVar17 || auVar21._0_4_ <= auVar16._0_4_)) {
            puVar6[uVar8 + 2] = 0x7fff;
            puVar6[uVar8 + 3] = 0x7fff;
          }
          uVar8 = uVar8 + 4;
          lVar19 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 4;
          auVar20._8_8_ = lVar19 + 4;
          lVar19 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 4;
          auVar18._8_8_ = lVar19 + 4;
        } while ((uVar7 + 3 & 0xfffffffffffffffc) != uVar8);
      }
      if ((ulong)uVar9 != 0) {
        puVar1 = tree->lengths;
        uVar8 = 0;
        iVar10 = 0;
        iVar17 = 0;
        do {
          uVar5 = puVar1[uVar8];
          if (uVar5 != 0) {
            puVar2 = tree->tree1d;
            iVar11 = -1;
            uVar12 = 1;
            do {
              bVar15 = iVar10 < 0;
              bVar14 = uVar9 < iVar10 + 2U;
              if (!bVar14 && !bVar15) {
                uVar13 = (uint)((puVar2[uVar8] >> (uVar5 + iVar11 & 0x1f) & 1) != 0) + iVar10 * 2;
                if (puVar6[uVar13] == 0x7fff) {
                  if (uVar12 == uVar5) {
                    puVar6[uVar13] = (uint)uVar8;
                    iVar10 = 0;
                  }
                  else {
                    iVar10 = iVar17 + 1;
                    puVar6[uVar13] = iVar17 + uVar9 + 1;
                    iVar17 = iVar10;
                  }
                }
                else {
                  iVar10 = puVar6[uVar13] - uVar9;
                }
              }
              if (bVar14 || bVar15) {
                return 0x37;
              }
              uVar5 = puVar1[uVar8];
              iVar11 = iVar11 + -1;
              bVar14 = uVar12 != uVar5;
              uVar12 = uVar12 + 1;
            } while (bVar14);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar9);
      }
      if (uVar9 * 2 == 0) {
        uVar9 = 0;
      }
      else {
        uVar8 = 0;
        uVar9 = 0;
        do {
          if (puVar6[uVar8] == 0x7fff) {
            puVar6[uVar8] = 0;
          }
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
    }
  }
  else {
    local_58.size = 0;
    local_58.allocsize = 0;
    free(local_58.data);
    local_58.data = (uint *)0x0;
    local_78.size = 0;
    local_78.allocsize = 0;
    free(local_78.data);
  }
  return uVar9;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned error = 0;
  unsigned bits, n;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount.data[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}